

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirD24(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  aint val;
  int e [390];
  
  iVar3 = 0;
  do {
    iVar2 = SkipBlanks();
    if (iVar2 == 0) {
      iVar2 = ParseExpressionNoSyntaxError(&lp,&val);
      if (iVar2 == 0) {
        Error("[D24] Syntax error",lp,SUPPRESS);
LAB_0010bfff:
        e[iVar3] = -1;
        if (iVar3 == 0) {
          Error("D24 with no arguments",(char *)0x0,PASS3);
        }
        else {
          if ((iVar3 == 0x180) && (*lp != '\0')) {
            Error("Over 128 values in D24. Values over",lp,SUPPRESS);
          }
          EmitBytes(e,false);
        }
        return;
      }
      check24(val);
      e[iVar3] = val & 0xff;
      e[(long)iVar3 + 1] = (uint)val >> 8 & 0xff;
      e[(long)iVar3 + 2] = (uint)val >> 0x10 & 0xff;
      iVar3 = iVar3 + 3;
    }
    else {
      Error("Expression expected",(char *)0x0,SUPPRESS);
    }
    bVar1 = comma(&lp);
    if ((!bVar1) || (0x17f < iVar3)) goto LAB_0010bfff;
  } while( true );
}

Assistant:

static void dirD24() {
	aint val;
	int teller = 0, e[130 * 3];
	do {
		if (SkipBlanks()) {
			Error("Expression expected", NULL, SUPPRESS);
		} else if (ParseExpressionNoSyntaxError(lp, val)) {
			check24(val);
			e[teller++] = val & 255; e[teller++] = (val >> 8) & 255; e[teller++] = (val >> 16) & 255;
		} else {
			Error("[D24] Syntax error", lp, SUPPRESS);
			break;
		}
	} while (comma(lp) && teller < 128*3);
	e[teller] = -1;
	if (teller == 128*3 && *lp) Error("Over 128 values in D24. Values over", lp, SUPPRESS);
	if (teller) EmitBytes(e);
	else		Error("D24 with no arguments");
}